

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool MultiplicationHelper<unsigned_int,_unsigned_long,_8>::Multiply
               (uint *t,unsigned_long *u,uint *ret)

{
  bool bVar1;
  uint *in_RDX;
  uint64_t *in_RSI;
  uint32_t *in_RDI;
  uint32_t tmp;
  uint64_t u1;
  uint32_t local_2c;
  uint64_t local_28;
  uint *local_20;
  bool local_1;
  
  local_28 = *in_RSI;
  local_2c = 0;
  local_20 = in_RDX;
  bVar1 = LargeIntRegMultiply<unsigned_int,_unsigned_long>::RegMultiply(*in_RDI,&local_28,&local_2c)
  ;
  if ((bVar1) &&
     (bVar1 = SafeCastHelper<unsigned_int,_unsigned_int,_0>::Cast(local_2c,local_20), bVar1)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool Multiply(const T& t, const U& u, T& ret) SAFEINT_NOTHROW
    {
        static_assert(safeint_internal::int_traits<U>::isUint64, "U must be Uint64");
        std::uint64_t u1 = u;
        std::uint32_t tmp = 0;

        if( LargeIntRegMultiply< std::uint32_t, std::uint64_t >::RegMultiply( t, u1, &tmp ) &&
            SafeCastHelper< T, std::uint32_t, GetCastMethod< T, std::uint32_t >::method >::Cast(tmp, ret) )
        {
            return true;
        }

        return false;
    }